

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

void __thiscall UDMFParser::ParseTextMap(UDMFParser *this,MapData *map)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  FName FVar5;
  FName FVar6;
  bool bVar7;
  DWORD DVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  uint *puVar13;
  ulong uVar14;
  ulong uVar15;
  vertex_t *__dest;
  vertex_t *__src;
  vertexdata_t *__dest_00;
  vertexdata_t *__src_00;
  sector_t_conflict *__dest_01;
  sector_t_conflict *__src_01;
  ulong *puVar16;
  extsector_t *peVar17;
  FName *this_00;
  ulong uVar18;
  extsector_t *local_578;
  sector_t_conflict *local_538;
  vertex_t *local_4f8;
  int local_484;
  undefined1 local_480 [4];
  int i;
  vertexdata_t vd;
  vertex_t vt;
  sector_t_conflict sec;
  undefined1 local_230 [8];
  intmapsidedef_t st;
  side_t si;
  line_t_conflict li;
  FMapThingUserData ud;
  uint userdatastart;
  FMapThing th;
  char *buffer;
  MapData *map_local;
  UDMFParser *this_local;
  
  DVar8 = MapData::Size(map,1);
  pcVar11 = (char *)operator_new__((ulong)DVar8);
  this->isTranslated = true;
  this->isExtended = false;
  this->floordrop = false;
  MapData::Read(map,1,pcVar11,-1);
  pcVar12 = FWadCollection::GetLumpFullName(&Wads,map->lumpnum);
  DVar8 = MapData::Size(map,1);
  FScanner::OpenMem((FScanner *)this,pcVar12,pcVar11,DVar8);
  if (pcVar11 != (char *)0x0) {
    operator_delete__(pcVar11);
  }
  FScanner::SetCMode((FScanner *)this,true);
  bVar7 = FScanner::CheckString((FScanner *)this,"namespace");
  if (bVar7) {
    FScanner::MustGetStringName((FScanner *)this,"=");
    FScanner::MustGetString((FScanner *)this);
    this_00 = &(this->super_UDMFParserBase).namespc;
    FName::operator=(this_00,(this->super_UDMFParserBase).sc.String);
    iVar9 = FName::operator_cast_to_int(this_00);
    if (iVar9 == 8) {
      (this->super_UDMFParserBase).namespace_bits = 1;
      P_LoadTranslator("xlat/doom_base.txt");
      ::level.flags2 = ::level.flags2 | 0x400000;
      this->floordrop = true;
    }
    else if (iVar9 == 9) {
      (this->super_UDMFParserBase).namespace_bits = 2;
      P_LoadTranslator("xlat/heretic_base.txt");
      ::level.flags2 = ::level.flags2 | 0x400000;
      this->floordrop = true;
    }
    else if (iVar9 == 10) {
      (this->super_UDMFParserBase).namespace_bits = 4;
      this->isTranslated = false;
    }
    else if (iVar9 == 0xb) {
      (this->super_UDMFParserBase).namespace_bits = 8;
      P_LoadTranslator("xlat/strife_base.txt");
      ::level.flags2 = ::level.flags2 | 0x600000;
      this->floordrop = true;
    }
    else if (iVar9 == 0x18c) {
      (this->super_UDMFParserBase).namespace_bits = 0x10;
      this->isTranslated = false;
    }
    else if (iVar9 == 0x18d) {
      ::level.flags2 = ::level.flags2 | 0x400000;
      (this->super_UDMFParserBase).namespace_bits = 0x20;
    }
    else if (iVar9 == 0x18e) {
      (this->super_UDMFParserBase).namespace_bits = 0x40;
      this->isTranslated = false;
    }
    else {
      pcVar11 = (this->super_UDMFParserBase).sc.String;
      pcVar12 = GameTypeName();
      Printf("Unknown namespace %s. Using defaults for %s\n",pcVar11,pcVar12);
      switch(gameinfo.gametype) {
      case GAME_Heretic:
        (this->super_UDMFParserBase).namespace_bits = 2;
        P_LoadTranslator("xlat/heretic_base.txt");
        break;
      default:
      case GAME_Doom:
      case GAME_Chex:
        (this->super_UDMFParserBase).namespace_bits = 1;
        P_LoadTranslator("xlat/doom_base.txt");
        break;
      case GAME_Hexen:
        (this->super_UDMFParserBase).namespace_bits = 4;
        this->isTranslated = false;
        break;
      case GAME_Strife:
        (this->super_UDMFParserBase).namespace_bits = 8;
        P_LoadTranslator("xlat/strife_base.txt");
      }
    }
    FScanner::MustGetStringName((FScanner *)this,";");
  }
  else {
    Printf("Map does not define a namespace.\n");
  }
  while (bVar7 = FScanner::GetString((FScanner *)this), bVar7) {
    bVar7 = FScanner::Compare((FScanner *)this,"thing");
    if (bVar7) {
      FMapThing::FMapThing((FMapThing *)&ud.Value);
      ud.Property.Index = TArray<FMapThingUserData,_FMapThingUserData>::Size(&MapThingsUserData);
      ParseThing(this,(FMapThing *)&ud.Value);
      TArray<FMapThing,_FMapThing>::Push(&MapThingsConverted,(FMapThing *)&ud.Value);
      FVar5 = ud.Property;
      uVar10 = TArray<FMapThingUserData,_FMapThingUserData>::Size(&MapThingsUserData);
      FVar6 = ud.Property;
      if ((uint)FVar5.Index < uVar10) {
        uVar10 = TArray<FMapThing,_FMapThing>::Size(&MapThingsConverted);
        puVar13 = TMap<unsigned_int,_unsigned_int,_THashTraits<unsigned_int>,_TValueTraits<unsigned_int>_>
                  ::operator[](&MapThingsUserDataIndex,uVar10 - 1);
        *puVar13 = FVar6.Index;
        FMapThingUserData::FMapThingUserData((FMapThingUserData *)&li.field_0x94);
        FName::operator=((FName *)&li.field_0x94,NAME_None);
        TArray<FMapThingUserData,_FMapThingUserData>::Push
                  (&MapThingsUserData,(FMapThingUserData *)&li.field_0x94);
      }
    }
    else {
      bVar7 = FScanner::Compare((FScanner *)this,"linedef");
      if (bVar7) {
        line_t::line_t((line_t *)&si.Index);
        uVar10 = TArray<line_t,_line_t>::Size(&this->ParsedLines);
        ParseLinedef(this,(line_t_conflict *)&si.Index,uVar10);
        TArray<line_t,_line_t>::Push(&this->ParsedLines,(line_t_conflict *)&si.Index);
      }
      else {
        bVar7 = FScanner::Compare((FScanner *)this,"sidedef");
        if (bVar7) {
          side_t::side_t((side_t *)&st.midtexture);
          intmapsidedef_t::intmapsidedef_t((intmapsidedef_t *)local_230);
          uVar10 = TArray<side_t,_side_t>::Size(&this->ParsedSides);
          ParseSidedef(this,(side_t *)&st.midtexture,(intmapsidedef_t *)local_230,uVar10);
          TArray<side_t,_side_t>::Push(&this->ParsedSides,(side_t *)&st.midtexture);
          TArray<intmapsidedef_t,_intmapsidedef_t>::Push
                    (&this->ParsedSideTextures,(intmapsidedef_t *)local_230);
          intmapsidedef_t::~intmapsidedef_t((intmapsidedef_t *)local_230);
        }
        else {
          bVar7 = FScanner::Compare((FScanner *)this,"sector");
          if (bVar7) {
            sector_t::sector_t((sector_t *)&vt.p.Y);
            uVar10 = TArray<sector_t,_sector_t>::Size(&this->ParsedSectors);
            ParseSector(this,(sector_t_conflict *)&vt.p.Y,uVar10);
            TArray<sector_t,_sector_t>::Push(&this->ParsedSectors,(sector_t_conflict *)&vt.p.Y);
          }
          else {
            bVar7 = FScanner::Compare((FScanner *)this,"vertex");
            if (bVar7) {
              vertex_t::vertex_t((vertex_t *)&vd.flags);
              ParseVertex(this,(vertex_t *)&vd.flags,(vertexdata_t *)local_480);
              TArray<vertex_t,_vertex_t>::Push(&this->ParsedVertices,(vertex_t *)&vd.flags);
              TArray<vertexdata_t,_vertexdata_t>::Push
                        (&this->ParsedVertexDatas,(vertexdata_t *)local_480);
            }
            else {
              UDMFParserBase::Skip(&this->super_UDMFParserBase);
            }
          }
        }
      }
    }
  }
  uVar10 = TArray<vertex_t,_vertex_t>::Size(&this->ParsedVertices);
  if (uVar10 == 0) {
    I_Error("Map has no vertices.\n");
  }
  uVar10 = TArray<sector_t,_sector_t>::Size(&this->ParsedSectors);
  if (uVar10 == 0) {
    I_Error("Map has no sectors. \n");
  }
  uVar10 = TArray<line_t,_line_t>::Size(&this->ParsedLines);
  if (uVar10 == 0) {
    I_Error("Map has no linedefs.\n");
  }
  uVar10 = TArray<side_t,_side_t>::Size(&this->ParsedSides);
  if (uVar10 == 0) {
    I_Error("Map has no sidedefs.\n");
  }
  numvertexes = TArray<vertex_t,_vertex_t>::Size(&this->ParsedVertices);
  uVar14 = (ulong)numvertexes;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar14;
  uVar15 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  __dest = (vertex_t *)operator_new__(uVar15);
  if (uVar14 != 0) {
    local_4f8 = __dest;
    do {
      vertex_t::vertex_t(local_4f8);
      local_4f8 = local_4f8 + 1;
    } while (local_4f8 != __dest + uVar14);
  }
  vertexes = __dest;
  __src = TArray<vertex_t,_vertex_t>::operator[](&this->ParsedVertices,0);
  memcpy(__dest,__src,(long)numvertexes << 4);
  numvertexdatas = TArray<vertexdata_t,_vertexdata_t>::Size(&this->ParsedVertexDatas);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)numvertexdatas;
  uVar14 = SUB168(auVar2 * ZEXT816(0x18),0);
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  __dest_00 = (vertexdata_t *)operator_new__(uVar14);
  vertexdatas = __dest_00;
  __src_00 = TArray<vertexdata_t,_vertexdata_t>::operator[](&this->ParsedVertexDatas,0);
  memcpy(__dest_00,__src_00,(long)numvertexdatas * 0x18);
  numsectors = TArray<sector_t,_sector_t>::Size(&this->ParsedSectors);
  uVar14 = (ulong)numsectors;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar14;
  uVar15 = SUB168(auVar3 * ZEXT816(0x218),0);
  if (SUB168(auVar3 * ZEXT816(0x218),8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  __dest_01 = (sector_t_conflict *)operator_new__(uVar15);
  if (uVar14 != 0) {
    local_538 = __dest_01;
    do {
      sector_t::sector_t((sector_t *)local_538);
      local_538 = local_538 + 1;
    } while (local_538 != __dest_01 + uVar14);
  }
  sectors = __dest_01;
  __src_01 = TArray<sector_t,_sector_t>::operator[](&this->ParsedSectors,0);
  memcpy(__dest_01,__src_01,(long)numsectors * 0x218);
  uVar14 = (ulong)numsectors;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar14;
  uVar15 = SUB168(auVar4 * ZEXT816(0xa0),0);
  uVar18 = uVar15 + 8;
  if (SUB168(auVar4 * ZEXT816(0xa0),8) != 0 || 0xfffffffffffffff7 < uVar15) {
    uVar18 = 0xffffffffffffffff;
  }
  puVar16 = (ulong *)operator_new__(uVar18);
  *puVar16 = uVar14;
  peVar17 = (extsector_t *)(puVar16 + 1);
  if (uVar14 != 0) {
    local_578 = peVar17;
    do {
      extsector_t::extsector_t(local_578);
      local_578 = local_578 + 1;
    } while (local_578 != peVar17 + uVar14);
  }
  sectors->e = peVar17;
  for (local_484 = 0; local_484 < numsectors; local_484 = local_484 + 1) {
    sectors[local_484].e = sectors->e + local_484;
  }
  ProcessLineDefs(this);
  return;
}

Assistant:

void ParseTextMap(MapData *map)
	{
		char *buffer = new char[map->Size(ML_TEXTMAP)];

		isTranslated = true;
		isExtended = false;
		floordrop = false;

		map->Read(ML_TEXTMAP, buffer);
		sc.OpenMem(Wads.GetLumpFullName(map->lumpnum), buffer, map->Size(ML_TEXTMAP));
		delete [] buffer;
		sc.SetCMode(true);
		if (sc.CheckString("namespace"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			namespc = sc.String;
			switch(namespc)
			{
			case NAME_ZDoom:
				namespace_bits = Zd;
				isTranslated = false;
				break;
			case NAME_ZDoomTranslated:
				level.flags2 |= LEVEL2_DUMMYSWITCHES;
				namespace_bits = Zdt;
				break;
			case NAME_Vavoom:
				namespace_bits = Va;
				isTranslated = false;
				break;
			case NAME_Hexen:
				namespace_bits = Hx;
				isTranslated = false;
				break;
			case NAME_Doom:
				namespace_bits = Dm;
				P_LoadTranslator("xlat/doom_base.txt");
				level.flags2 |= LEVEL2_DUMMYSWITCHES;
				floordrop = true;
				break;
			case NAME_Heretic:
				namespace_bits = Ht;
				P_LoadTranslator("xlat/heretic_base.txt");
				level.flags2 |= LEVEL2_DUMMYSWITCHES;
				floordrop = true;
				break;
			case NAME_Strife:
				namespace_bits = St;
				P_LoadTranslator("xlat/strife_base.txt");
				level.flags2 |= LEVEL2_DUMMYSWITCHES|LEVEL2_RAILINGHACK;
				floordrop = true;
				break;
			default:
				Printf("Unknown namespace %s. Using defaults for %s\n", sc.String, GameTypeName());
				switch (gameinfo.gametype)
				{
				default:			// Shh, GCC
				case GAME_Doom:
				case GAME_Chex:
					namespace_bits = Dm;
					P_LoadTranslator("xlat/doom_base.txt");
					break;
				case GAME_Heretic:
					namespace_bits = Ht;
					P_LoadTranslator("xlat/heretic_base.txt");
					break;
				case GAME_Strife:
					namespace_bits = St;
					P_LoadTranslator("xlat/strife_base.txt");
					break;
				case GAME_Hexen:
					namespace_bits = Hx;
					isTranslated = false;
					break;
				}
			}
			sc.MustGetStringName(";");
		}
		else
		{
			Printf("Map does not define a namespace.\n");
		}

		while (sc.GetString())
		{
			if (sc.Compare("thing"))
			{
				FMapThing th;
				unsigned userdatastart = MapThingsUserData.Size();
				ParseThing(&th);
				MapThingsConverted.Push(th);
				if (userdatastart < MapThingsUserData.Size())
				{ // User data added
					MapThingsUserDataIndex[MapThingsConverted.Size()-1] = userdatastart;
					// Mark end of the user data for this map thing
					FMapThingUserData ud;
					ud.Property = NAME_None;
					ud.Value = 0;
					MapThingsUserData.Push(ud);
				}
			}
			else if (sc.Compare("linedef"))
			{
				line_t li;
				ParseLinedef(&li, ParsedLines.Size());
				ParsedLines.Push(li);
			}
			else if (sc.Compare("sidedef"))
			{
				side_t si;
				intmapsidedef_t st;
				ParseSidedef(&si, &st, ParsedSides.Size());
				ParsedSides.Push(si);
				ParsedSideTextures.Push(st);
			}
			else if (sc.Compare("sector"))
			{
				sector_t sec;
				ParseSector(&sec, ParsedSectors.Size());
				ParsedSectors.Push(sec);
			}
			else if (sc.Compare("vertex"))
			{
				vertex_t vt;
				vertexdata_t vd;
				ParseVertex(&vt, &vd);
				ParsedVertices.Push(vt);
				ParsedVertexDatas.Push(vd);
			}
			else
			{
				Skip();
			}
		}

		// Catch bogus maps here rather than during nodebuilding
		if (ParsedVertices.Size() == 0)	I_Error("Map has no vertices.\n");
		if (ParsedSectors.Size() == 0)	I_Error("Map has no sectors. \n");
		if (ParsedLines.Size() == 0)	I_Error("Map has no linedefs.\n");
		if (ParsedSides.Size() == 0)	I_Error("Map has no sidedefs.\n");

		// Create the real vertices
		numvertexes = ParsedVertices.Size();
		vertexes = new vertex_t[numvertexes];
		memcpy(vertexes, &ParsedVertices[0], numvertexes * sizeof(*vertexes));

		// Create the real vertex datas
		numvertexdatas = ParsedVertexDatas.Size();
		vertexdatas = new vertexdata_t[numvertexdatas];
		memcpy(vertexdatas, &ParsedVertexDatas[0], numvertexdatas * sizeof(*vertexdatas));

		// Create the real sectors
		numsectors = ParsedSectors.Size();
		sectors = new sector_t[numsectors];
		memcpy(sectors, &ParsedSectors[0], numsectors * sizeof(*sectors));
		sectors[0].e = new extsector_t[numsectors];
		for(int i = 0; i < numsectors; i++)
		{
			sectors[i].e = &sectors[0].e[i];
		}

		// Create the real linedefs and decompress the sidedefs
		ProcessLineDefs();
	}